

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void vector_gautbl_alloc(vector_gautbl_t *gautbl,int32 n_gau,int32 veclen,logmath_t *logmath)

{
  float32 **ppfVar1;
  float64 fVar2;
  logmath_t *logmath_local;
  int32 veclen_local;
  int32 n_gau_local;
  vector_gautbl_t *gautbl_local;
  
  gautbl->n_gau = n_gau;
  gautbl->veclen = veclen;
  ppfVar1 = (float32 **)
            __ckd_calloc_2d__((long)n_gau,(long)veclen,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                              ,0x224);
  gautbl->mean = ppfVar1;
  ppfVar1 = (float32 **)
            __ckd_calloc_2d__((long)n_gau,(long)veclen,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                              ,0x226);
  gautbl->var = ppfVar1;
  fVar2 = logmath_log_to_ln(logmath,-0x38000000);
  gautbl->distfloor = fVar2;
  return;
}

Assistant:

void
vector_gautbl_alloc(vector_gautbl_t * gautbl, int32 n_gau, int32 veclen, logmath_t * logmath)
{
    gautbl->n_gau = n_gau;
    gautbl->veclen = veclen;
    gautbl->mean =
        (float32 **) ckd_calloc_2d(n_gau, veclen, sizeof(float32));
    gautbl->var =
        (float32 **) ckd_calloc_2d(n_gau, veclen, sizeof(float32));
    /*    gautbl->lrd = (float32 *) ckd_calloc (n_gau, sizeof(float32)); */
    gautbl->distfloor = logmath_log_to_ln(logmath, S3_LOGPROB_ZERO);
}